

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleAsciiCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  int iVar1;
  pointer pbVar2;
  pointer pbVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  allocator<char> local_79;
  string output;
  string error;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar3 - (long)pbVar2) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"No output variable specified",(allocator<char> *)&error);
    cmCommand::SetError(&this->super_cmCommand,&output);
    std::__cxx11::string::~string((string *)&output);
    bVar6 = false;
  }
  else {
    name = pbVar3 + -1;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    lVar5 = 0x20;
    for (uVar4 = 1; bVar6 = ((long)pbVar3 - (long)pbVar2 >> 5) - 1U <= uVar4, !bVar6;
        uVar4 = uVar4 + 1) {
      iVar1 = atoi(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      if (0xfe < iVar1 - 1U) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"Character with code ",&local_79);
        std::__cxx11::string::append((string *)&error);
        std::__cxx11::string::append((char *)&error);
        cmCommand::SetError(&this->super_cmCommand,&error);
        std::__cxx11::string::~string((string *)&error);
        goto LAB_0023232b;
      }
      std::__cxx11::string::push_back((char)&output);
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x20;
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,output._M_dataplus._M_p);
LAB_0023232b:
    std::__cxx11::string::~string((string *)&output);
  }
  return bVar6;
}

Assistant:

bool cmStringCommand::HandleAsciiCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("No output variable specified");
    return false;
  }
  std::string::size_type cc;
  std::string const& outvar = args.back();
  std::string output;
  for (cc = 1; cc < args.size() - 1; cc++) {
    int ch = atoi(args[cc].c_str());
    if (ch > 0 && ch < 256) {
      output += static_cast<char>(ch);
    } else {
      std::string error = "Character with code ";
      error += args[cc];
      error += " does not exist.";
      this->SetError(error);
      return false;
    }
  }
  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}